

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O0

type cm::operator==(StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *l,basic_string_view<char,_std::char_traits<char>_> *r)

{
  type tVar1;
  string_view local_48;
  string local_38;
  string_view *local_18;
  basic_string_view<char,_std::char_traits<char>_> *r_local;
  StringOpPlus<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *l_local;
  
  local_18 = r;
  r_local = &l->l;
  StringOpPlus::operator_cast_to_string(&local_38,(StringOpPlus *)l);
  local_48 = AsStringView<std::basic_string_view<char,_std::char_traits<char>_>_>::view(local_18);
  tVar1 = operator==(&local_38,&local_48);
  std::__cxx11::string::~string((string *)&local_38);
  return tVar1;
}

Assistant:

typename std::enable_if<AsStringView<R>::value, bool>::type operator==(
  StringOpPlus<LL, LR> const& l, R&& r)
{
  return std::string(l) == AsStringView<R>::view(std::forward<R>(r));
}